

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

string * jwt::base::decode(string *__return_storage_ptr__,string *base,array<char,_64UL> *alphabet,
                          string *fill)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  runtime_error *prVar4;
  size_type sVar5;
  long lVar6;
  char *pcVar7;
  size_t i_2;
  long lVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  size_type sVar12;
  ulong uVar13;
  bool bVar14;
  string *res;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  sVar12 = base->_M_string_length;
  sVar5 = fill->_M_string_length;
  lVar11 = 0;
  while (sVar5 < sVar12) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)base);
    plVar2 = local_50;
    if (local_48 == fill->_M_string_length) {
      if (local_48 == 0) {
        bVar14 = true;
      }
      else {
        iVar3 = bcmp(local_50,(fill->_M_dataplus)._M_p,local_48);
        bVar14 = iVar3 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if (plVar2 != local_40) {
      operator_delete(plVar2,local_40[0] + 1);
    }
    if (!bVar14) break;
    sVar5 = fill->_M_string_length;
    sVar12 = sVar12 - sVar5;
    lVar11 = lVar11 + -1;
    if (lVar11 == -3) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
LAB_0010786e:
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (((int)sVar12 - (int)lVar11 & 3U) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid input");
    goto LAB_0010786e;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar13 = sVar12 & 0xfffffffffffffffc;
  uVar9 = 0;
  while (cVar10 = (char)__return_storage_ptr__, uVar9 < uVar13) {
    pcVar1 = (base->_M_dataplus)._M_p;
    lVar6 = 0;
    while (alphabet->_M_elems[lVar6] != pcVar1[uVar9]) {
      lVar6 = lVar6 + 1;
      if (lVar6 == 0x40) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid input");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    lVar6 = 0;
    while (alphabet->_M_elems[lVar6] != pcVar1[uVar9 + 1]) {
      lVar6 = lVar6 + 1;
      if (lVar6 == 0x40) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid input");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    lVar6 = 0;
    pcVar7 = alphabet->_M_elems;
    while (*pcVar7 != pcVar1[uVar9 + 2]) {
      lVar6 = lVar6 + -0x40;
      pcVar7 = pcVar7 + 1;
      if (lVar6 == -0x1000) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid input");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    lVar6 = uVar9 + 3;
    uVar9 = uVar9 + 4;
    lVar8 = 0;
    while (alphabet->_M_elems[lVar8] != pcVar1[lVar6]) {
      lVar8 = lVar8 + 1;
      if (lVar8 == 0x40) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid input");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
  }
  if (lVar11 == 0) {
    return __return_storage_ptr__;
  }
  pcVar1 = (base->_M_dataplus)._M_p;
  lVar6 = 0;
  pcVar7 = alphabet->_M_elems;
  do {
    if (*pcVar7 == pcVar1[uVar13]) {
      lVar6 = 0;
      do {
        if (alphabet->_M_elems[lVar6] == pcVar1[uVar13 + 1]) {
          if (lVar11 == -1) {
            lVar11 = 0;
            while (alphabet->_M_elems[0] != pcVar1[uVar13 + 2]) {
              lVar11 = lVar11 + 0x40;
              alphabet = (array<char,_64UL> *)((long)alphabet + 1);
              if (lVar11 == 0x1000) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar4,"Invalid input");
                goto LAB_00107a7b;
              }
            }
            std::__cxx11::string::push_back(cVar10);
          }
          std::__cxx11::string::push_back(cVar10);
          return __return_storage_ptr__;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
      goto LAB_00107a7b;
    }
    lVar6 = lVar6 + 0x40000;
    pcVar7 = pcVar7 + 1;
  } while (lVar6 != 0x1000000);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Invalid input");
LAB_00107a7b:
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string decode(const std::string& base, const std::array<char, 64>& alphabet, const std::string& fill) {
			size_t size = base.size();

			size_t fill_cnt = 0;
			while (size > fill.size()) {
				if (base.substr(size - fill.size(), fill.size()) == fill) {
					fill_cnt++;
					size -= fill.size();
					if(fill_cnt > 2)
						throw std::runtime_error("Invalid input");
				}
				else break;
			}

			if ((size + fill_cnt) % 4 != 0)
				throw std::runtime_error("Invalid input");

			size_t out_size = size / 4 * 3;
			std::string res;
			res.reserve(out_size);

			auto get_sextet = [&](size_t offset) {
				for (size_t i = 0; i < alphabet.size(); i++) {
					if (alphabet[i] == base[offset])
						return static_cast<uint32_t>(i);
				}
				throw std::runtime_error("Invalid input");
			};

			
			size_t fast_size = size - size % 4;
			for (size_t i = 0; i < fast_size;) {
				uint32_t sextet_a = get_sextet(i++);
				uint32_t sextet_b = get_sextet(i++);
				uint32_t sextet_c = get_sextet(i++);
				uint32_t sextet_d = get_sextet(i++);

				uint32_t triple = (sextet_a << 3 * 6)
					+ (sextet_b << 2 * 6)
					+ (sextet_c << 1 * 6)
					+ (sextet_d << 0 * 6);

				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				res += (triple >> 0 * 8) & 0xFF;
			}

			if (fill_cnt == 0)
				return res;

			uint32_t triple = (get_sextet(fast_size) << 3 * 6)
				+ (get_sextet(fast_size + 1) << 2 * 6);

			switch (fill_cnt) {
			case 1:
				triple |= (get_sextet(fast_size + 2) << 1 * 6);
				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				break;
			case 2:
				res += (triple >> 2 * 8) & 0xFF;
				break;
			default:
				break;
			}

			return res;
		}